

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int sam_hdr_write(htsFile *fp,bam_hdr_t *h)

{
  kstring_t *s;
  cram_fd *fd;
  hFILE *fp_00;
  int iVar1;
  SAM_hdr *hdr;
  size_t totalbytes;
  char *pcVar2;
  size_t sVar3;
  size_t __n;
  ulong uVar4;
  int i;
  long lVar5;
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    bam_hdr_write((fp->fp).bgzf,h);
    break;
  case text_format:
    (fp->format).category = sequence_data;
    (fp->format).format = sam;
  case sam:
    pcVar2 = h->text;
    fp_00 = (fp->fp).hfile;
    totalbytes = strlen(pcVar2);
    uVar4 = (long)fp_00->limit - (long)fp_00->begin;
    __n = totalbytes;
    if (uVar4 < totalbytes) {
      __n = uVar4;
    }
    memcpy(fp_00->begin,pcVar2,__n);
    fp_00->begin = fp_00->begin + __n;
    if (uVar4 < totalbytes) {
      hputs2(pcVar2,totalbytes,__n,fp_00);
    }
    pcVar2 = strstr(h->text,"@SQ\t");
    if (pcVar2 == (char *)0x0) {
      s = &fp->line;
      lVar5 = 0;
      while (lVar5 < h->n_targets) {
        (fp->line).l = 0;
        kputsn("@SQ\tSN:",7,s);
        kputs(h->target_name[lVar5],s);
        kputsn("\tLN:",4,s);
        kputw(h->target_len[lVar5],s);
        kputc(10,s);
        sVar3 = hwrite((fp->fp).hfile,(fp->line).s,(fp->line).l);
        lVar5 = lVar5 + 1;
        if (sVar3 != (fp->line).l) {
          return -1;
        }
      }
    }
    iVar1 = hflush((fp->fp).hfile);
    if (iVar1 != 0) {
      return -1;
    }
    break;
  default:
    abort();
  case cram:
    fd = (fp->fp).cram;
    hdr = bam_header_to_cram(h);
    iVar1 = cram_set_header(fd,hdr);
    if (iVar1 < 0) {
      return -1;
    }
    if (fp->fn_aux != (char *)0x0) {
      cram_load_reference(fd,fp->fn_aux);
    }
    iVar1 = cram_write_SAM_hdr(fd,fd->header);
    if (iVar1 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int sam_hdr_write(htsFile *fp, const bam_hdr_t *h)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        bam_hdr_write(fp->fp.bgzf, h);
        break;

    case cram: {
        cram_fd *fd = fp->fp.cram;
        if (cram_set_header(fd, bam_header_to_cram((bam_hdr_t *)h)) < 0) return -1;
        if (fp->fn_aux)
            cram_load_reference(fd, fp->fn_aux);
        if (cram_write_SAM_hdr(fd, fd->header) < 0) return -1;
        }
        break;

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam: {
        char *p;
        hputs(h->text, fp->fp.hfile);
        p = strstr(h->text, "@SQ\t"); // FIXME: we need a loop to make sure "@SQ\t" does not match something unwanted!!!
        if (p == 0) {
            int i;
            for (i = 0; i < h->n_targets; ++i) {
                fp->line.l = 0;
                kputsn("@SQ\tSN:", 7, &fp->line); kputs(h->target_name[i], &fp->line);
                kputsn("\tLN:", 4, &fp->line); kputw(h->target_len[i], &fp->line); kputc('\n', &fp->line);
                if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
            }
        }
        if ( hflush(fp->fp.hfile) != 0 ) return -1;
        }
        break;

    default:
        abort();
    }
    return 0;
}